

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_freeCCtx(ZSTD_CCtx *cctx)

{
  int iVar1;
  int cctxInWorkspace;
  ZSTD_CCtx *cctx_local;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  else if (cctx->staticSize == 0) {
    iVar1 = ZSTD_cwksp_owns_buffer(&cctx->workspace,cctx);
    ZSTD_freeCCtxContent(cctx);
    if (iVar1 == 0) {
      ZSTD_customFree(cctx,cctx->customMem);
    }
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc0;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_freeCCtx(ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                    "not compatible with static CCtx");
    {
        int cctxInWorkspace = ZSTD_cwksp_owns_buffer(&cctx->workspace, cctx);
        ZSTD_freeCCtxContent(cctx);
        if (!cctxInWorkspace) {
            ZSTD_customFree(cctx, cctx->customMem);
        }
    }
    return 0;
}